

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O0

void __thiscall amrex::BoxArray::BoxArray(BoxArray *this,Box *bxvec,int nbox)

{
  Box *pBVar1;
  int in_EDX;
  Box *in_RSI;
  BATransformer *in_RDI;
  Box bx;
  int i;
  int i_1;
  size_type in_stack_ffffffffffffff58;
  Vector<amrex::Box,_std::allocator<amrex::Box>_> *this_00;
  pointer in_stack_ffffffffffffff70;
  IndexType t;
  pointer pBVar2;
  undefined8 local_88;
  pointer local_80;
  undefined4 in_stack_ffffffffffffff88;
  uint uVar3;
  undefined4 in_stack_ffffffffffffff8c;
  int iVar4;
  Box *local_68;
  int local_4c;
  
  t.itype = (uint)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  Box::ixType(in_RSI);
  BATransformer::BATransformer(in_RDI,t);
  std::make_shared<amrex::BARef,int&>
            ((int *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  std::shared_ptr<amrex::BoxList>::shared_ptr((shared_ptr<amrex::BoxList> *)0x1251d4c);
  local_68 = in_RSI;
  for (iVar4 = 0; iVar4 < in_EDX; iVar4 = iVar4 + 1) {
    pBVar2 = *(pointer *)(local_68->smallend).vect;
    local_88 = *(pointer *)((local_68->smallend).vect + 2);
    local_80 = *(pointer *)((local_68->bigend).vect + 1);
    uVar3 = (local_68->btype).itype;
    this_00 = (Vector<amrex::Box,_std::allocator<amrex::Box>_> *)&stack0xffffffffffffff70;
    for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
      if ((uVar3 & 1 << ((byte)local_4c & 0x1f)) != 0) {
        *(int *)((long)&local_88 + (long)local_4c * 4 + 4) =
             *(int *)((long)&local_88 + (long)local_4c * 4 + 4) + -1;
      }
    }
    uVar3 = 0;
    std::__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<amrex::BARef,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1251ea8);
    pBVar1 = Vector<amrex::Box,_std::allocator<amrex::Box>_>::operator[]
                       (this_00,in_stack_ffffffffffffff58);
    *(pointer *)(pBVar1->smallend).vect = pBVar2;
    *(pointer *)((pBVar1->smallend).vect + 2) = local_88;
    *(pointer *)((pBVar1->bigend).vect + 1) = local_80;
    (pBVar1->btype).itype = uVar3;
    local_68 = local_68 + 1;
  }
  return;
}

Assistant:

BoxArray::BoxArray (const Box* bxvec, int nbox)
    :
    m_bat(bxvec->ixType()),
    m_ref(std::make_shared<BARef>(nbox))
{
    for (int i = 0; i < nbox; i++) {
        m_ref->m_abox[i] = amrex::enclosedCells(*bxvec++);
    }
}